

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collapse_unit_test.cpp
# Opt level: O0

void __thiscall collapse::test_method(collapse *this)

{
  initializer_list<std::tuple<short,_short,_float>_> __l;
  initializer_list<std::tuple<short,_short,_float>_> __l_00;
  initializer_list<std::tuple<short,_short,_float>_> __l_01;
  initializer_list<std::tuple<short,_short,_float>_> __l_02;
  initializer_list<std::tuple<short,_short,_float>_> __l_03;
  ostream *this_00;
  allocator<std::tuple<short,_short,_float>_> local_2b9;
  double local_2b8;
  int local_2b0 [2];
  double local_2a8;
  int local_2a0 [2];
  double local_298;
  int local_290 [2];
  tuple<short,_short,_float> local_288;
  tuple<short,_short,_float> local_280;
  tuple<short,_short,_float> local_278;
  tuple<short,_short,_float> *local_270;
  size_type local_268;
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_260;
  double local_248;
  int local_240 [2];
  double local_238;
  int local_22c [2];
  allocator<std::tuple<short,_short,_float>_> local_221;
  double local_220;
  int local_218 [2];
  double local_210;
  int local_208 [2];
  tuple<short,_short,_float> local_200;
  tuple<short,_short,_float> local_1f8;
  tuple<short,_short,_float> *local_1f0;
  size_type local_1e8;
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_1e0;
  double local_1c8;
  int local_1c0 [2];
  double local_1b8;
  int local_1ac [2];
  allocator<std::tuple<short,_short,_float>_> local_1a1;
  double local_1a0;
  int local_198 [2];
  tuple<short,_short,_float> local_190;
  tuple<short,_short,_float> *local_188;
  size_type local_180;
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_178;
  double local_160;
  int local_158 [2];
  double local_150;
  int local_148 [2];
  double local_140;
  int local_134 [2];
  allocator<std::tuple<short,_short,_float>_> local_129;
  double local_128;
  int local_120 [2];
  tuple<short,_short,_float> local_118;
  tuple<short,_short,_float> *local_110;
  size_type local_108;
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_100;
  double local_e8;
  int local_e0 [2];
  double local_d8;
  int local_d0 [2];
  vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_c8;
  allocator<std::tuple<short,_short,_float>_> local_99;
  double local_98;
  int local_90 [2];
  double local_88;
  int local_80 [2];
  double local_78;
  int local_70 [2];
  double local_68;
  int local_60 [2];
  tuple<short,_short,_float> local_58;
  tuple<short,_short,_float> local_50;
  tuple<short,_short,_float> local_48;
  tuple<short,_short,_float> local_40;
  tuple<short,_short,_float> *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  Filtered_edge_list edges;
  collapse *this_local;
  
  edges.
  super__Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_00 = std::operator<<((ostream *)&std::cout,"***** COLLAPSE *****");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_60[1] = 0;
  local_60[0] = 1;
  local_68 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_58,local_60 + 1,local_60,&local_68);
  local_70[1] = 1;
  local_70[0] = 2;
  local_78 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_50,local_70 + 1,local_70,&local_78);
  local_80[1] = 2;
  local_80[0] = 3;
  local_88 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_48,local_80 + 1,local_80,&local_88);
  local_90[1] = 3;
  local_90[0] = 0;
  local_98 = 1.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_40,local_90 + 1,local_90,&local_98);
  local_30 = 4;
  local_38 = &local_58;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_99);
  __l_03._M_len = local_30;
  __l_03._M_array = local_38;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)local_28,__l_03,&local_99);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_99);
  local_c8.
  super__Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_c8);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            ((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
              *)local_28,&local_c8);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_c8);
  local_d0[1] = 0;
  local_d0[0] = 2;
  local_d8 = 2.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_d0 + 1,local_d0,&local_d8);
  local_e0[1] = 1;
  local_e0[0] = 3;
  local_e8 = 2.1;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_e0 + 1,local_e0,&local_e8);
  local_120[1] = 1;
  local_120[0] = 3;
  local_128 = 2.1;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_118,local_120 + 1,local_120,&local_128);
  local_108 = 1;
  local_110 = &local_118;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_129);
  __l_02._M_len = local_108;
  __l_02._M_array = local_110;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_100,__l_02,&local_129);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            ((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
              *)local_28,&local_100);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_100);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_129);
  local_134[1] = 2;
  local_134[0] = 4;
  local_140 = 3.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_134 + 1,local_134,&local_140);
  local_148[1] = 4;
  local_148[0] = 5;
  local_150 = 3.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_148 + 1,local_148,&local_150);
  local_158[1] = 5;
  local_158[0] = 3;
  local_160 = 3.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_158 + 1,local_158,&local_160);
  local_198[1] = 1;
  local_198[0] = 3;
  local_1a0 = 2.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_190,local_198 + 1,local_198,&local_1a0);
  local_180 = 1;
  local_188 = &local_190;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_1a1);
  __l_01._M_len = local_180;
  __l_01._M_array = local_188;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_178,__l_01,&local_1a1);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            ((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
              *)local_28,&local_178);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_178);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_1a1);
  local_1ac[1] = 2;
  local_1ac[0] = 5;
  local_1b8 = 4.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_1ac + 1,local_1ac,&local_1b8);
  local_1c0[1] = 4;
  local_1c0[0] = 3;
  local_1c8 = 4.1;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_1c0 + 1,local_1c0,&local_1c8);
  local_208[1] = 1;
  local_208[0] = 3;
  local_210 = 2.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_200,local_208 + 1,local_208,&local_210);
  local_218[1] = 4;
  local_218[0] = 3;
  local_220 = 4.1;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_1f8,local_218 + 1,local_218,&local_220);
  local_1e8 = 2;
  local_1f0 = &local_200;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_221);
  __l_00._M_len = local_1e8;
  __l_00._M_array = local_1f0;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_1e0,__l_00,&local_221);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            ((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
              *)local_28,&local_1e0);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_1e0);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_221);
  local_22c[1] = 1;
  local_22c[0] = 5;
  local_238 = 5.0;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_22c + 1,local_22c,&local_238);
  local_240[1] = 0;
  local_240[0] = 4;
  local_248 = 5.1;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             local_28,local_240 + 1,local_240,&local_248);
  local_290[1] = 1;
  local_290[0] = 3;
  local_298 = 2.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_288,local_290 + 1,local_290,&local_298);
  local_2a0[1] = 4;
  local_2a0[0] = 3;
  local_2a8 = 4.0;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_280,local_2a0 + 1,local_2a0,&local_2a8);
  local_2b0[1] = 0;
  local_2b0[0] = 4;
  local_2b8 = 5.1;
  std::tuple<short,_short,_float>::tuple<int,_int,_double,_true,_true>
            (&local_278,local_2b0 + 1,local_2b0,&local_2b8);
  local_268 = 3;
  local_270 = &local_288;
  std::allocator<std::tuple<short,_short,_float>_>::allocator(&local_2b9);
  __l._M_len = local_268;
  __l._M_array = local_270;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&local_260,__l,&local_2b9);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            ((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
              *)local_28,&local_260);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector(&local_260);
  std::allocator<std::tuple<short,_short,_float>_>::~allocator(&local_2b9);
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
           *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(collapse) {
  std::cout << "***** COLLAPSE *****" << std::endl;
  //  1   2
  //  o---o
  //  |   |
  //  |   |
  //  |   |
  //  o---o
  //  0   3
  Filtered_edge_list edges {{0, 1, 1.},
                            {1, 2, 1.},
                            {2, 3, 1.},
                            {3, 0, 1.}};
  trace_and_check_collapse(edges, {});
  
  //  1   2
  //  o---o
  //  |\ /|
  //  | x |
  //  |/ \|
  //  o---o
  //  0   3
  edges.emplace_back(0, 2, 2.);
  edges.emplace_back(1, 3, 2.1);
  trace_and_check_collapse(edges, {{1, 3, 2.1}});

  //  1   2   4
  //  o---o---o
  //  |\ /|   |
  //  | x |   |
  //  |/ \|   |
  //  o---o---o
  //  0   3   5
  edges.emplace_back(2, 4, 3.);
  edges.emplace_back(4, 5, 3.);
  edges.emplace_back(5, 3, 3.);
  trace_and_check_collapse(edges, {{1, 3, 2.}});

  //  1   2   4
  //  o---o---o
  //  |\ /|\ /|
  //  | x | x |
  //  |/ \|/ \|
  //  o---o---o
  //  0   3   5
  edges.emplace_back(2, 5, 4.);
  edges.emplace_back(4, 3, 4.1);
  trace_and_check_collapse(edges, {{1, 3, 2.}, {4, 3, 4.1}});

  //  1   2   4
  //  o---o---o
  //  |\ /|\ /|
  //  | x | x |  + [0,4] and [1,5]
  //  |/ \|/ \|
  //  o---o---o
  //  0   3   5
  edges.emplace_back(1, 5, 5.);
  edges.emplace_back(0, 4, 5.1);
  trace_and_check_collapse(edges, {{1, 3, 2.}, {4, 3, 4.}, {0, 4, 5.1}});
}